

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O3

int readMPS_LP_dense_cpp
              (char *filename,int mxNumRow,int mxNumCol,int *numRow_p,int *numCol_p,int *objSense_p,
              double *objOffset_p,double **A_rw_p,double **rhs_p,double **cost_p,double **lb_p,
              double **ub_p)

{
  int iVar1;
  int *integerColumn;
  int *local_8;
  
  iVar1 = readMPS_dense_cpp(filename,mxNumRow,mxNumCol,numRow_p,numCol_p,objSense_p,objOffset_p,
                            A_rw_p,rhs_p,cost_p,lb_p,ub_p,&local_8);
  return iVar1;
}

Assistant:

int readMPS_LP_dense_cpp(const char *filename, int mxNumRow, int mxNumCol, 
			 int* numRow_p, int* numCol_p, int* objSense_p, double* objOffset_p,
			 double ** A_rw_p,
			 double ** rhs_p, double ** cost_p, double ** lb_p, double ** ub_p) {
  
  int *integerColumn;
  int rtCd = readMPS_dense_cpp(filename, mxNumRow, mxNumCol,
			       numRow_p, numCol_p, objSense_p, objOffset_p,
			       A_rw_p,
			       rhs_p, cost_p, lb_p, ub_p,
			       &integerColumn);
  return rtCd;
}